

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O3

bool __thiscall Shell::TermAlgebra::finiteDomain(TermAlgebra *this)

{
  OperatorType *pOVar1;
  ulong n;
  bool bVar2;
  
  if (this->_n != 0) {
    n = 0;
    do {
      if ((this->_constrs)._capacity <= n) {
        Lib::Array<Shell::TermAlgebraConstructor_*>::expandToFit(&this->_constrs,n);
      }
      pOVar1 = (this->_constrs)._array[n]->_type;
      bVar2 = (pOVar1->_typeArgsArity - 1) + *(int *)pOVar1->_key == 0;
    } while ((bVar2) && (n = n + 1, n < this->_n));
    return bVar2;
  }
  return true;
}

Assistant:

bool TermAlgebra::finiteDomain()
{
  for (unsigned i = 0; i < _n; i++) {
    if (_constrs[i]->arity() > 0) {
      return false;
    }
  }

  return true;
}